

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsEndpointSubscribe(HelicsEndpoint endpoint,char *key,HelicsError *err)

{
  string_view key_00;
  EndpointObject *pEVar1;
  HelicsError *in_RDX;
  long in_RSI;
  EndpointObject *endObj;
  HelicsError *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  Endpoint *in_stack_ffffffffffffffd0;
  size_t in_stack_ffffffffffffffd8;
  
  pEVar1 = anon_unknown.dwarf_784a3::verifyEndpoint
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (pEVar1 != (EndpointObject *)0x0) {
    if (in_RSI == 0) {
      assignError(in_RDX,-4,"The supplied string argument is null and therefore invalid");
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
      key_00._M_str = (char *)pEVar1;
      key_00._M_len = in_stack_ffffffffffffffd8;
      helics::Endpoint::subscribe(in_stack_ffffffffffffffd0,key_00);
    }
  }
  return;
}

Assistant:

void helicsEndpointSubscribe(HelicsEndpoint endpoint, const char* key, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    CHECK_NULL_STRING(key, void());
    try {
        endObj->endPtr->subscribe(key);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}